

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wallet.cpp
# Opt level: O2

void __thiscall
wallet::CWallet::RecursiveUpdateTxState
          (CWallet *this,WalletBatch *batch,uint256 *tx_hash,TryUpdatingStateFn *try_updating_state)

{
  key_type *__x;
  long lVar1;
  element_type *peVar2;
  TxUpdate TVar3;
  iterator iVar4;
  _Node_iterator_base<std::pair<const_COutPoint,_uint256>,_false> _Var5;
  size_type sVar6;
  uint i;
  ulong uVar7;
  const_iterator iter;
  long in_FS_OFFSET;
  pair<std::__detail::_Node_iterator<std::pair<const_COutPoint,_uint256>,_false,_false>,_std::__detail::_Node_iterator<std::pair<const_COutPoint,_uint256>,_false,_false>_>
  pVar8;
  key_type local_e8;
  uint256 now;
  set<uint256,_std::less<uint256>,_std::allocator<uint256>_> done;
  set<uint256,_std::less<uint256>,_std::allocator<uint256>_> todo;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  todo._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &todo._M_t._M_impl.super__Rb_tree_header._M_header;
  todo._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  todo._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  todo._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  done._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &done._M_t._M_impl.super__Rb_tree_header._M_header;
  done._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  done._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  done._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  done._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       done._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  todo._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       todo._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  std::_Rb_tree<uint256,uint256,std::_Identity<uint256>,std::less<uint256>,std::allocator<uint256>>
  ::_M_insert_unique<uint256_const&>
            ((_Rb_tree<uint256,uint256,std::_Identity<uint256>,std::less<uint256>,std::allocator<uint256>>
              *)&todo,tx_hash);
  while( true ) {
    if (todo._M_t._M_impl.super__Rb_tree_header._M_node_count == 0) {
      std::
      _Rb_tree<uint256,_uint256,_std::_Identity<uint256>,_std::less<uint256>,_std::allocator<uint256>_>
      ::~_Rb_tree(&done._M_t);
      std::
      _Rb_tree<uint256,_uint256,_std::_Identity<uint256>,_std::less<uint256>,_std::allocator<uint256>_>
      ::~_Rb_tree(&todo._M_t);
      if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
        return;
      }
      __stack_chk_fail();
    }
    now.super_base_blob<256U>.m_data._M_elems._0_8_ =
         *(undefined8 *)(todo._M_t._M_impl.super__Rb_tree_header._M_header._M_left + 1);
    now.super_base_blob<256U>.m_data._M_elems._8_8_ =
         todo._M_t._M_impl.super__Rb_tree_header._M_header._M_left[1]._M_parent;
    now.super_base_blob<256U>.m_data._M_elems._16_8_ =
         todo._M_t._M_impl.super__Rb_tree_header._M_header._M_left[1]._M_left;
    now.super_base_blob<256U>.m_data._M_elems._24_8_ =
         todo._M_t._M_impl.super__Rb_tree_header._M_header._M_left[1]._M_right;
    std::
    _Rb_tree<uint256,_uint256,_std::_Identity<uint256>,_std::less<uint256>,_std::allocator<uint256>_>
    ::erase(&todo._M_t,&now);
    std::
    _Rb_tree<uint256,uint256,std::_Identity<uint256>,std::less<uint256>,std::allocator<uint256>>::
    _M_insert_unique<uint256_const&>
              ((_Rb_tree<uint256,uint256,std::_Identity<uint256>,std::less<uint256>,std::allocator<uint256>>
                *)&done,&now);
    iVar4 = std::
            _Hashtable<uint256,_std::pair<const_uint256,_wallet::CWalletTx>,_std::allocator<std::pair<const_uint256,_wallet::CWalletTx>_>,_std::__detail::_Select1st,_std::equal_to<uint256>,_SaltedTxidHasher,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
            ::find(&(this->mapWallet)._M_h,&now);
    if (iVar4.super__Node_iterator_base<std::pair<const_uint256,_wallet::CWalletTx>,_true>._M_cur ==
        (__node_type *)0x0) break;
    TVar3 = std::function<wallet::CWallet::TxUpdate_(wallet::CWalletTx_&)>::operator()
                      (try_updating_state,
                       (CWalletTx *)
                       ((long)iVar4.
                              super__Node_iterator_base<std::pair<const_uint256,_wallet::CWalletTx>,_true>
                              ._M_cur + 0x28));
    if (TVar3 != UNCHANGED) {
      *(undefined8 *)
       ((long)iVar4.super__Node_iterator_base<std::pair<const_uint256,_wallet::CWalletTx>,_true>.
              _M_cur + 0x90) = 0;
      *(undefined8 *)
       ((long)iVar4.super__Node_iterator_base<std::pair<const_uint256,_wallet::CWalletTx>,_true>.
              _M_cur + 0xd8) = 0;
      *(undefined8 *)
       ((long)iVar4.super__Node_iterator_base<std::pair<const_uint256,_wallet::CWalletTx>,_true>.
              _M_cur + 0x120) = 0;
      *(undefined8 *)
       ((long)iVar4.super__Node_iterator_base<std::pair<const_uint256,_wallet::CWalletTx>,_true>.
              _M_cur + 0x168) = 0;
      *(undefined2 *)
       ((long)iVar4.super__Node_iterator_base<std::pair<const_uint256,_wallet::CWalletTx>,_true>.
              _M_cur + 0x1b0) = 1;
      if (batch != (WalletBatch *)0x0) {
        WalletBatch::WriteTx
                  (batch,(CWalletTx *)
                         ((long)iVar4.
                                super__Node_iterator_base<std::pair<const_uint256,_wallet::CWalletTx>,_true>
                                ._M_cur + 0x28));
      }
      uVar7 = 0;
      while( true ) {
        peVar2 = (((CTransactionRef *)
                  ((long)iVar4.
                         super__Node_iterator_base<std::pair<const_uint256,_wallet::CWalletTx>,_true>
                         ._M_cur + 0x1c0))->
                 super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
        if ((ulong)(((long)(peVar2->vout).super__Vector_base<CTxOut,_std::allocator<CTxOut>_>.
                           _M_impl.super__Vector_impl_data._M_finish -
                    (long)(peVar2->vout).super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl
                          .super__Vector_impl_data._M_start) / 0x28) <= uVar7) break;
        local_e8.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x10] =
             now.super_base_blob<256U>.m_data._M_elems[0x10];
        local_e8.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x11] =
             now.super_base_blob<256U>.m_data._M_elems[0x11];
        local_e8.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x12] =
             now.super_base_blob<256U>.m_data._M_elems[0x12];
        local_e8.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x13] =
             now.super_base_blob<256U>.m_data._M_elems[0x13];
        local_e8.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x14] =
             now.super_base_blob<256U>.m_data._M_elems[0x14];
        local_e8.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x15] =
             now.super_base_blob<256U>.m_data._M_elems[0x15];
        local_e8.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x16] =
             now.super_base_blob<256U>.m_data._M_elems[0x16];
        local_e8.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x17] =
             now.super_base_blob<256U>.m_data._M_elems[0x17];
        local_e8.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x18] =
             now.super_base_blob<256U>.m_data._M_elems[0x18];
        local_e8.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x19] =
             now.super_base_blob<256U>.m_data._M_elems[0x19];
        local_e8.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x1a] =
             now.super_base_blob<256U>.m_data._M_elems[0x1a];
        local_e8.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x1b] =
             now.super_base_blob<256U>.m_data._M_elems[0x1b];
        local_e8.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x1c] =
             now.super_base_blob<256U>.m_data._M_elems[0x1c];
        local_e8.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x1d] =
             now.super_base_blob<256U>.m_data._M_elems[0x1d];
        local_e8.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x1e] =
             now.super_base_blob<256U>.m_data._M_elems[0x1e];
        local_e8.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x1f] =
             now.super_base_blob<256U>.m_data._M_elems[0x1f];
        local_e8.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0] =
             now.super_base_blob<256U>.m_data._M_elems[0];
        local_e8.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[1] =
             now.super_base_blob<256U>.m_data._M_elems[1];
        local_e8.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[2] =
             now.super_base_blob<256U>.m_data._M_elems[2];
        local_e8.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[3] =
             now.super_base_blob<256U>.m_data._M_elems[3];
        local_e8.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[4] =
             now.super_base_blob<256U>.m_data._M_elems[4];
        local_e8.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[5] =
             now.super_base_blob<256U>.m_data._M_elems[5];
        local_e8.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[6] =
             now.super_base_blob<256U>.m_data._M_elems[6];
        local_e8.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[7] =
             now.super_base_blob<256U>.m_data._M_elems[7];
        local_e8.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[8] =
             now.super_base_blob<256U>.m_data._M_elems[8];
        local_e8.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[9] =
             now.super_base_blob<256U>.m_data._M_elems[9];
        local_e8.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[10] =
             now.super_base_blob<256U>.m_data._M_elems[10];
        local_e8.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0xb] =
             now.super_base_blob<256U>.m_data._M_elems[0xb];
        local_e8.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0xc] =
             now.super_base_blob<256U>.m_data._M_elems[0xc];
        local_e8.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0xd] =
             now.super_base_blob<256U>.m_data._M_elems[0xd];
        local_e8.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0xe] =
             now.super_base_blob<256U>.m_data._M_elems[0xe];
        local_e8.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0xf] =
             now.super_base_blob<256U>.m_data._M_elems[0xf];
        local_e8.n = (uint32_t)uVar7;
        pVar8 = std::
                _Hashtable<COutPoint,_std::pair<const_COutPoint,_uint256>,_std::allocator<std::pair<const_COutPoint,_uint256>_>,_std::__detail::_Select1st,_std::equal_to<COutPoint>,_SaltedOutpointHasher,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_false>_>
                ::equal_range(&(this->mapTxSpends)._M_h,&local_e8);
        for (_Var5._M_cur = (__node_type *)
                            pVar8.first.
                            super__Node_iterator_base<std::pair<const_COutPoint,_uint256>,_false>.
                            _M_cur;
            (_Node_iterator_base<std::pair<const_COutPoint,_uint256>,_false>)_Var5._M_cur !=
            pVar8.second.super__Node_iterator_base<std::pair<const_COutPoint,_uint256>,_false>.
            _M_cur.super__Node_iterator_base<std::pair<const_COutPoint,_uint256>,_false>;
            _Var5._M_cur = (__node_type *)((_Var5._M_cur)->super__Hash_node_base)._M_nxt) {
          __x = (key_type *)
                ((long)&((_Var5._M_cur)->
                        super__Hash_node_value<std::pair<const_COutPoint,_uint256>,_false>).
                        super__Hash_node_value_base<std::pair<const_COutPoint,_uint256>_>._M_storage
                        ._M_storage + 0x24);
          sVar6 = std::set<uint256,_std::less<uint256>,_std::allocator<uint256>_>::count(&done,__x);
          if (sVar6 == 0) {
            std::
            _Rb_tree<uint256,uint256,std::_Identity<uint256>,std::less<uint256>,std::allocator<uint256>>
            ::_M_insert_unique<uint256_const&>
                      ((_Rb_tree<uint256,uint256,std::_Identity<uint256>,std::less<uint256>,std::allocator<uint256>>
                        *)&todo,__x);
          }
        }
        uVar7 = (ulong)((uint32_t)uVar7 + 1);
      }
      if (TVar3 == NOTIFY_CHANGED) {
        boost::signals2::
        signal<void_(const_uint256_&,_ChangeType),_boost::signals2::optional_last_value<void>,_int,_std::less<int>,_boost::function<void_(const_uint256_&,_ChangeType)>,_boost::function<void_(const_boost::signals2::connection_&,_const_uint256_&,_ChangeType)>,_boost::signals2::mutex>
        ::operator()(&this->NotifyTransactionChanged,&(peVar2->hash).m_wrapped,CT_UPDATED);
      }
      MarkInputsDirty(this,(CTransactionRef *)
                           ((long)iVar4.
                                  super__Node_iterator_base<std::pair<const_uint256,_wallet::CWalletTx>,_true>
                                  ._M_cur + 0x1c0));
    }
  }
  __assert_fail("it != mapWallet.end()",
                "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/wallet/wallet.cpp"
                ,0x56f,
                "void wallet::CWallet::RecursiveUpdateTxState(WalletBatch *, const uint256 &, const TryUpdatingStateFn &)"
               );
}

Assistant:

void CWallet::RecursiveUpdateTxState(WalletBatch* batch, const uint256& tx_hash, const TryUpdatingStateFn& try_updating_state) {
    std::set<uint256> todo;
    std::set<uint256> done;

    todo.insert(tx_hash);

    while (!todo.empty()) {
        uint256 now = *todo.begin();
        todo.erase(now);
        done.insert(now);
        auto it = mapWallet.find(now);
        assert(it != mapWallet.end());
        CWalletTx& wtx = it->second;

        TxUpdate update_state = try_updating_state(wtx);
        if (update_state != TxUpdate::UNCHANGED) {
            wtx.MarkDirty();
            if (batch) batch->WriteTx(wtx);
            // Iterate over all its outputs, and update those tx states as well (if applicable)
            for (unsigned int i = 0; i < wtx.tx->vout.size(); ++i) {
                std::pair<TxSpends::const_iterator, TxSpends::const_iterator> range = mapTxSpends.equal_range(COutPoint(Txid::FromUint256(now), i));
                for (TxSpends::const_iterator iter = range.first; iter != range.second; ++iter) {
                    if (!done.count(iter->second)) {
                        todo.insert(iter->second);
                    }
                }
            }

            if (update_state == TxUpdate::NOTIFY_CHANGED) {
                NotifyTransactionChanged(wtx.GetHash(), CT_UPDATED);
            }

            // If a transaction changes its tx state, that usually changes the balance
            // available of the outputs it spends. So force those to be recomputed
            MarkInputsDirty(wtx.tx);
        }
    }
}